

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall doctest::String::operator+(String *this,String *other)

{
  String *in_RDX;
  String *in_RSI;
  String *in_RDI;
  String *this_00;
  String *other_00;
  
  this_00 = in_RDI;
  other_00 = in_RDX;
  String(in_RDI,in_RDI);
  operator+=(in_RSI,other_00);
  String(this_00,in_RDI);
  ~String(in_RDX);
  return this_00;
}

Assistant:

String String::operator+(const String& other) const { return String(*this) += other; }